

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

bool __thiscall pg::QPTSolver::lift(QPTSolver *this,int v,int target)

{
  int maxopp;
  uint64_t *puVar1;
  int *piVar2;
  pg *ppVar3;
  bool bVar4;
  int i;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  unsigned_long uVar8;
  long lVar9;
  ulong uVar10;
  Game *pGVar11;
  int iVar12;
  int to;
  uint uVar13;
  char *pcVar14;
  _label_vertex *p_Var15;
  QPTSolver *pQVar16;
  int iVar17;
  ulong in_R8;
  pg *ppVar18;
  pg *this_00;
  int *piVar19;
  pg apStack_b0 [8];
  pg apStack_a8 [8];
  pg apStack_a0 [8];
  pg apStack_98 [8];
  _label_vertex local_90;
  undefined1 *local_80;
  _label_vertex local_78;
  int local_68;
  int local_64;
  _label_vertex local_60;
  pg *local_50;
  long local_48;
  int local_40;
  int local_3c;
  QPTSolver *local_38;
  
  iVar12 = this->k * v;
  uVar13 = this->pm_nodes[iVar12];
  if ((uVar13 != 0xffffffff) && ((uVar13 & 1) == this->pl)) {
    return false;
  }
  local_80 = apStack_98;
  local_50 = (pg *)(this->pm_nodes + iVar12);
  ppVar18 = apStack_98 + -((ulong)(uint)this->k * 4 + 0xf & 0xfffffffffffffff0);
  local_48 = (long)v;
  local_64 = ((this->super_Solver).game)->_priority[local_48];
  this_00 = ppVar18 + -((ulong)(uint)this->k * 4 + 0xf & 0xfffffffffffffff0);
  local_38 = this;
  local_68 = this->strategy[local_48];
  if (1 < (this->super_Solver).trace) {
    poVar7 = (this->super_Solver).logger;
    *(undefined8 *)(this_00 + -8) = 0x159d4d;
    poVar7 = std::operator<<(poVar7,"\x1b[37;1mupdating vertex ");
    local_60.g = (local_38->super_Solver).game;
    local_60.v = v;
    *(undefined8 *)(this_00 + -8) = 0x159d68;
    poVar7 = operator<<(poVar7,&local_60);
    pQVar16 = local_38;
    *(undefined8 *)(this_00 + -8) = 0x159d77;
    iVar12 = Solver::owner(&pQVar16->super_Solver,v);
    pcVar14 = " (odd)";
    if (iVar12 == 0) {
      pcVar14 = " (even)";
    }
    *(undefined8 *)(this_00 + -8) = 0x159d93;
    poVar7 = std::operator<<(poVar7,pcVar14);
    *(undefined8 *)(this_00 + -8) = 0x159da2;
    std::operator<<(poVar7,"\x1b[m with current measure");
    ppVar3 = local_50;
    poVar7 = (local_38->super_Solver).logger;
    iVar12 = local_38->k;
    *(undefined8 *)(this_00 + -8) = 0x159dba;
    pm_stream(poVar7,(int *)ppVar3,iVar12);
    poVar7 = (local_38->super_Solver).logger;
    *(undefined8 *)(this_00 + -8) = 0x159dc7;
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pQVar16 = local_38;
  if (target == -1) {
    iVar12 = local_38->strategy[local_48];
  }
  else {
    *(undefined8 *)(this_00 + -8) = 0x159de0;
    iVar5 = Solver::owner(&pQVar16->super_Solver,v);
    iVar12 = local_64;
    if (iVar5 == local_38->pl) {
      iVar6 = local_38->k;
      iVar17 = local_38->max;
      maxopp = local_38->maxo;
      local_3c = v;
      piVar19 = local_38->pm_nodes;
      *(ulong *)(this_00 + -0x10) = CONCAT44(extraout_var,iVar5);
      *(undefined8 *)(this_00 + -0x18) = 0x159e1f;
      au((int *)ppVar18,piVar19 + iVar6 * target,iVar12,iVar6,iVar17,maxopp,
         *(int *)(this_00 + -0x10));
      iVar12 = local_38->pl;
      uVar13 = local_38->k;
      *(undefined8 *)(this_00 + -8) = 0x159e3f;
      uVar8 = pm_val((int *)ppVar18,uVar13,iVar12);
      pQVar16 = local_38;
      if (local_38->goal < uVar8) {
        *(int *)ppVar18 = local_38->max;
      }
      if (1 < (pQVar16->super_Solver).trace) {
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x159e6e;
        poVar7 = std::operator<<(poVar7,"to successor ");
        local_60.g = (local_38->super_Solver).game;
        local_60.v = target;
        *(undefined8 *)(this_00 + -8) = 0x159e89;
        poVar7 = operator<<(poVar7,&local_60);
        *(undefined8 *)(this_00 + -8) = 0x159e98;
        std::operator<<(poVar7,":");
        poVar7 = (local_38->super_Solver).logger;
        iVar12 = local_38->k;
        piVar19 = local_38->pm_nodes;
        *(undefined8 *)(this_00 + -8) = 0x159ec1;
        pm_stream(poVar7,piVar19 + iVar12 * target,iVar12);
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x159ed5;
        std::operator<<(poVar7," => ");
        poVar7 = (local_38->super_Solver).logger;
        iVar12 = local_38->k;
        *(undefined8 *)(this_00 + -8) = 0x159eec;
        pm_stream(poVar7,(int *)ppVar18,iVar12);
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x159ef9;
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar12 = local_38->pl;
        uVar13 = local_38->k;
      }
      ppVar3 = local_50;
      piVar19 = (int *)(ulong)uVar13;
      *(undefined8 *)(this_00 + -8) = 0x159f17;
      bVar4 = pm_less(ppVar3,(int *)ppVar18,piVar19,iVar12,iVar17);
      pQVar16 = local_38;
      if (!bVar4) {
        return false;
      }
      for (lVar9 = 0; lVar9 < (int)piVar19; lVar9 = lVar9 + 1) {
        *(undefined4 *)(local_50 + lVar9 * 4) = *(undefined4 *)(ppVar18 + lVar9 * 4);
        piVar19 = (int *)(ulong)(uint)local_38->k;
      }
      if (((local_38->super_Solver).trace != 0) &&
         (iVar12 = local_38->strategy[local_48], iVar12 != target)) {
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x15a4fd;
        std::operator<<(poVar7,"\x1b[1;38;5;208m");
        poVar7 = (pQVar16->super_Solver).logger;
        if (iVar12 == -1) {
          *(undefined8 *)(this_00 + -8) = 0x15a6e3;
          poVar7 = std::operator<<(poVar7,"set strategy\x1b[m of \x1b[36;1m");
          local_60.g = (pQVar16->super_Solver).game;
          local_60.v = local_3c;
          *(undefined8 *)(this_00 + -8) = 0x15a6fc;
          poVar7 = operator<<(poVar7,&local_60);
          *(undefined8 *)(this_00 + -8) = 0x15a70b;
          poVar7 = std::operator<<(poVar7,"\x1b[m to \x1b[36;1m");
          pGVar11 = (pQVar16->super_Solver).game;
          p_Var15 = &local_78;
        }
        else {
          *(undefined8 *)(this_00 + -8) = 0x15a516;
          poVar7 = std::operator<<(poVar7,"changed strategy\x1b[m of \x1b[36;1m");
          local_60.g = (pQVar16->super_Solver).game;
          local_60.v = local_3c;
          *(undefined8 *)(this_00 + -8) = 0x15a52f;
          poVar7 = operator<<(poVar7,&local_60);
          *(undefined8 *)(this_00 + -8) = 0x15a53e;
          poVar7 = std::operator<<(poVar7,"\x1b[m from \x1b[36;1m");
          local_78.g = (pQVar16->super_Solver).game;
          local_78.v = pQVar16->strategy[local_48];
          *(undefined8 *)(this_00 + -8) = 0x15a55f;
          poVar7 = operator<<(poVar7,&local_78);
          *(undefined8 *)(this_00 + -8) = 0x15a56e;
          poVar7 = std::operator<<(poVar7,"\x1b[m to \x1b[36;1m");
          pGVar11 = (pQVar16->super_Solver).game;
          p_Var15 = &local_90;
        }
        p_Var15->g = pGVar11;
        p_Var15->v = target;
        *(undefined8 *)(this_00 + -8) = 0x15a722;
        poVar7 = operator<<(poVar7,p_Var15);
        *(undefined8 *)(this_00 + -8) = 0x15a731;
        std::operator<<(poVar7,"\x1b[m\n");
      }
      ppVar18 = local_50;
      pQVar16->strategy[local_48] = target;
      if ((pQVar16->super_Solver).trace == 0) {
        return true;
      }
      poVar7 = (pQVar16->super_Solver).logger;
      *(undefined8 *)(this_00 + -8) = 0x15a767;
      poVar7 = std::operator<<(poVar7,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m");
      local_60.g = (pQVar16->super_Solver).game;
      local_60.v = local_3c;
      *(undefined8 *)(this_00 + -8) = 0x15a784;
      poVar7 = operator<<(poVar7,&local_60);
      *(undefined8 *)(this_00 + -8) = 0x15a793;
      std::operator<<(poVar7,"\x1b[m:");
      poVar7 = (pQVar16->super_Solver).logger;
      iVar12 = pQVar16->k;
      *(undefined8 *)(this_00 + -8) = 0x15a7a2;
      pm_stream(poVar7,(int *)ppVar18,iVar12);
      poVar7 = (pQVar16->super_Solver).logger;
      *(undefined8 *)(this_00 + -8) = 0x15a7b2;
      poVar7 = std::operator<<(poVar7," (to ");
      local_60.g = (pQVar16->super_Solver).game;
      local_60.v = target;
      goto LAB_0015a7bd;
    }
    iVar12 = local_38->strategy[local_48];
    if (iVar12 != -1 && iVar12 != target) {
      return false;
    }
  }
  iVar5 = local_64;
  local_40 = iVar12;
  bVar4 = iVar12 == -1;
  pQVar16 = local_38;
  if (!bVar4) {
    iVar6 = local_38->k;
    uVar13 = local_38->max;
    in_R8 = (ulong)uVar13;
    iVar17 = local_38->maxo;
    piVar19 = local_38->pm_nodes;
    *(ulong *)(this_00 + -0x10) = (ulong)(uint)local_38->pl;
    *(undefined8 *)(this_00 + -0x18) = 0x159fae;
    au((int *)ppVar18,piVar19 + iVar6 * iVar12,iVar5,iVar6,uVar13,iVar17,*(int *)(this_00 + -0x10));
    uVar13 = local_38->k;
    iVar12 = local_38->pl;
    *(undefined8 *)(this_00 + -8) = 0x159fc8;
    uVar8 = pm_val((int *)ppVar18,uVar13,iVar12);
    pQVar16 = local_38;
    if (local_38->goal < uVar8) {
      *(int *)ppVar18 = local_38->max;
    }
    if (1 < (pQVar16->super_Solver).trace) {
      poVar7 = (local_38->super_Solver).logger;
      *(undefined8 *)(this_00 + -8) = 0x159ff7;
      poVar7 = std::operator<<(poVar7,"to successor ");
      iVar5 = local_40;
      local_60.g = (local_38->super_Solver).game;
      local_60.v = local_40;
      *(undefined8 *)(this_00 + -8) = 0x15a019;
      poVar7 = operator<<(poVar7,&local_60);
      *(undefined8 *)(this_00 + -8) = 0x15a028;
      std::operator<<(poVar7,":");
      poVar7 = (local_38->super_Solver).logger;
      iVar12 = local_38->k;
      piVar19 = local_38->pm_nodes;
      *(undefined8 *)(this_00 + -8) = 0x15a054;
      pm_stream(poVar7,piVar19 + iVar12 * iVar5,iVar12);
      poVar7 = (local_38->super_Solver).logger;
      *(undefined8 *)(this_00 + -8) = 0x15a068;
      std::operator<<(poVar7," => ");
      poVar7 = (local_38->super_Solver).logger;
      iVar12 = local_38->k;
      *(undefined8 *)(this_00 + -8) = 0x15a07f;
      pm_stream(poVar7,(int *)ppVar18,iVar12);
      poVar7 = (local_38->super_Solver).logger;
      *(undefined8 *)(this_00 + -8) = 0x15a08c;
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar13 = local_38->k;
      pQVar16 = local_38;
    }
    iVar12 = local_40;
    for (uVar10 = 0; (~((int)uVar13 >> 0x1f) & uVar13) != uVar10; uVar10 = uVar10 + 1) {
      *(undefined4 *)(this_00 + uVar10 * 4) = *(undefined4 *)(ppVar18 + uVar10 * 4);
    }
  }
  pGVar11 = (pQVar16->super_Solver).game;
  local_3c = v;
  piVar19 = pGVar11->_outedges + pGVar11->_firstouts[local_48];
  while( true ) {
    ppVar3 = local_50;
    iVar5 = *piVar19;
    uVar10 = (ulong)iVar5;
    if (uVar10 == 0xffffffffffffffff) break;
    if ((iVar5 != iVar12) &&
       (puVar1 = ((pQVar16->super_Solver).disabled)->_bits, *(undefined8 *)(this_00 + -8) = 1,
       iVar6 = local_64, (*(long *)(this_00 + -8) << (uVar10 & 0x3f) & puVar1[uVar10 >> 6]) == 0)) {
      iVar12 = pQVar16->k;
      uVar13 = pQVar16->max;
      in_R8 = (ulong)uVar13;
      iVar17 = pQVar16->maxo;
      piVar2 = pQVar16->pm_nodes;
      *(ulong *)(this_00 + -0x10) = (ulong)(uint)pQVar16->pl;
      *(undefined8 *)(this_00 + -0x18) = 0x15a134;
      au((int *)ppVar18,piVar2 + iVar12 * iVar5,iVar6,iVar12,uVar13,iVar17,*(int *)(this_00 + -0x10)
        );
      iVar12 = local_38->pl;
      iVar6 = local_38->k;
      *(undefined8 *)(this_00 + -8) = 0x15a14c;
      uVar8 = pm_val((int *)ppVar18,iVar6,iVar12);
      pQVar16 = local_38;
      if (local_38->goal < uVar8) {
        *(int *)ppVar18 = local_38->max;
      }
      if (1 < (pQVar16->super_Solver).trace) {
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x15a17b;
        poVar7 = std::operator<<(poVar7,"to successor ");
        local_60.g = (local_38->super_Solver).game;
        local_60.v = iVar5;
        *(undefined8 *)(this_00 + -8) = 0x15a196;
        poVar7 = operator<<(poVar7,&local_60);
        *(undefined8 *)(this_00 + -8) = 0x15a1a5;
        std::operator<<(poVar7,":");
        poVar7 = (local_38->super_Solver).logger;
        iVar12 = local_38->k;
        piVar2 = local_38->pm_nodes;
        *(undefined8 *)(this_00 + -8) = 0x15a1cd;
        pm_stream(poVar7,piVar2 + iVar12 * iVar5,iVar12);
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x15a1e1;
        std::operator<<(poVar7," => ");
        poVar7 = (local_38->super_Solver).logger;
        iVar12 = local_38->k;
        *(undefined8 *)(this_00 + -8) = 0x15a1f8;
        pm_stream(poVar7,(int *)ppVar18,iVar12);
        poVar7 = (local_38->super_Solver).logger;
        *(undefined8 *)(this_00 + -8) = 0x15a205;
        std::endl<char,std::char_traits<char>>(poVar7);
        pQVar16 = local_38;
      }
      iVar6 = local_3c;
      iVar12 = local_40;
      if (bVar4) {
        uVar13 = pQVar16->k;
        for (uVar10 = 0; (~((int)uVar13 >> 0x1f) & uVar13) != uVar10; uVar10 = uVar10 + 1) {
          *(undefined4 *)(this_00 + uVar10 * 4) = *(undefined4 *)(ppVar18 + uVar10 * 4);
        }
      }
      else {
        *(undefined8 *)(this_00 + -8) = 0x15a243;
        iVar6 = Solver::owner(&pQVar16->super_Solver,iVar6);
        iVar12 = pQVar16->pl;
        uVar13 = pQVar16->k;
        if (iVar6 == iVar12) {
          *(undefined8 *)(this_00 + -8) = 0x15a25f;
          bVar4 = pm_less(this_00,(int *)ppVar18,(int *)(ulong)uVar13,iVar6,(int)in_R8);
          pQVar16 = local_38;
          iVar12 = local_40;
          if (!bVar4) {
LAB_0015a2d3:
            bVar4 = false;
            pQVar16 = local_38;
            iVar12 = local_40;
            goto LAB_0015a2dd;
          }
          for (uVar10 = 0; (~((int)uVar13 >> 0x1f) & uVar13) != uVar10; uVar10 = uVar10 + 1) {
            *(undefined4 *)(this_00 + uVar10 * 4) = *(undefined4 *)(ppVar18 + uVar10 * 4);
          }
        }
        else {
          *(undefined8 *)(this_00 + -8) = 0x15a298;
          bVar4 = pm_less(ppVar18,(int *)this_00,(int *)(ulong)uVar13,iVar12,(int)in_R8);
          pQVar16 = local_38;
          iVar12 = local_40;
          if (!bVar4) goto LAB_0015a2d3;
          for (uVar10 = 0; (~((int)uVar13 >> 0x1f) & uVar13) != uVar10; uVar10 = uVar10 + 1) {
            *(undefined4 *)(this_00 + uVar10 * 4) = *(undefined4 *)(ppVar18 + uVar10 * 4);
          }
        }
      }
      bVar4 = false;
      pQVar16->strategy[local_48] = iVar5;
    }
LAB_0015a2dd:
    piVar19 = piVar19 + 1;
  }
  piVar19 = (int *)(ulong)(uint)pQVar16->k;
  iVar12 = pQVar16->pl;
  *(undefined8 *)(this_00 + -8) = 0x15a2ff;
  bVar4 = pm_less(ppVar3,(int *)this_00,piVar19,iVar12,(int)in_R8);
  iVar5 = local_3c;
  iVar12 = local_68;
  if (!bVar4) {
    if (((pQVar16->super_Solver).trace != 0) && (local_68 != pQVar16->strategy[local_48])) {
      *(undefined8 *)(this_00 + -8) = 0x15a359;
      iVar6 = Solver::owner(&pQVar16->super_Solver,iVar5);
      poVar7 = (pQVar16->super_Solver).logger;
      pcVar14 = "\x1b[1;31m";
      if (iVar6 == pQVar16->pl) {
        pcVar14 = "\x1b[1;38;5;208m";
      }
      *(undefined8 *)(this_00 + -8) = 0x15a378;
      std::operator<<(poVar7,pcVar14);
      poVar7 = (pQVar16->super_Solver).logger;
      if (iVar12 == -1) {
        *(undefined8 *)(this_00 + -8) = 0x15a58a;
        poVar7 = std::operator<<(poVar7,"set strategy\x1b[m of \x1b[36;1m");
        local_60.g = (pQVar16->super_Solver).game;
        local_60.v = iVar5;
        *(undefined8 *)(this_00 + -8) = 0x15a5a1;
        poVar7 = operator<<(poVar7,&local_60);
        *(undefined8 *)(this_00 + -8) = 0x15a5b0;
        poVar7 = std::operator<<(poVar7,"\x1b[m to \x1b[36;1m");
        pGVar11 = (pQVar16->super_Solver).game;
        iVar12 = pQVar16->strategy[local_48];
        p_Var15 = &local_78;
      }
      else {
        *(undefined8 *)(this_00 + -8) = 0x15a392;
        poVar7 = std::operator<<(poVar7,"changed strategy\x1b[m of \x1b[36;1m");
        local_60.g = (pQVar16->super_Solver).game;
        local_60.v = iVar5;
        *(undefined8 *)(this_00 + -8) = 0x15a3a9;
        poVar7 = operator<<(poVar7,&local_60);
        *(undefined8 *)(this_00 + -8) = 0x15a3b8;
        poVar7 = std::operator<<(poVar7,"\x1b[m from \x1b[36;1m");
        local_78.g = (pQVar16->super_Solver).game;
        local_78.v = iVar12;
        *(undefined8 *)(this_00 + -8) = 0x15a3cf;
        poVar7 = operator<<(poVar7,&local_78);
        *(undefined8 *)(this_00 + -8) = 0x15a3de;
        poVar7 = std::operator<<(poVar7,"\x1b[m to \x1b[36;1m");
        pGVar11 = (pQVar16->super_Solver).game;
        iVar12 = pQVar16->strategy[local_48];
        p_Var15 = &local_90;
      }
      p_Var15->g = pGVar11;
      p_Var15->v = iVar12;
      *(undefined8 *)(this_00 + -8) = 0x15a5d1;
      poVar7 = operator<<(poVar7,p_Var15);
      *(undefined8 *)(this_00 + -8) = 0x15a5e0;
      std::operator<<(poVar7,"\x1b[m\n");
    }
    return false;
  }
  for (lVar9 = 0; lVar9 < (int)piVar19; lVar9 = lVar9 + 1) {
    *(undefined4 *)(local_50 + lVar9 * 4) = *(undefined4 *)(this_00 + lVar9 * 4);
    piVar19 = (int *)(ulong)(uint)pQVar16->k;
  }
  if ((pQVar16->super_Solver).trace == 0) {
    return true;
  }
  if (local_68 != pQVar16->strategy[local_48]) {
    *(undefined8 *)(this_00 + -8) = 0x15a42c;
    iVar6 = Solver::owner(&pQVar16->super_Solver,iVar5);
    poVar7 = (pQVar16->super_Solver).logger;
    pcVar14 = "\x1b[1;31m";
    if (iVar6 == pQVar16->pl) {
      pcVar14 = "\x1b[1;38;5;208m";
    }
    *(undefined8 *)(this_00 + -8) = 0x15a44b;
    std::operator<<(poVar7,pcVar14);
    poVar7 = (pQVar16->super_Solver).logger;
    if (iVar12 == -1) {
      *(undefined8 *)(this_00 + -8) = 0x15a5f4;
      poVar7 = std::operator<<(poVar7,"set strategy\x1b[m of \x1b[36;1m");
      local_60.g = (pQVar16->super_Solver).game;
      local_60.v = iVar5;
      *(undefined8 *)(this_00 + -8) = 0x15a60b;
      poVar7 = operator<<(poVar7,&local_60);
      *(undefined8 *)(this_00 + -8) = 0x15a61a;
      poVar7 = std::operator<<(poVar7,"\x1b[m to \x1b[36;1m");
      pGVar11 = (pQVar16->super_Solver).game;
      iVar12 = pQVar16->strategy[local_48];
      p_Var15 = &local_78;
    }
    else {
      *(undefined8 *)(this_00 + -8) = 0x15a465;
      poVar7 = std::operator<<(poVar7,"changed strategy\x1b[m of \x1b[36;1m");
      local_60.g = (pQVar16->super_Solver).game;
      local_60.v = iVar5;
      *(undefined8 *)(this_00 + -8) = 0x15a47c;
      poVar7 = operator<<(poVar7,&local_60);
      *(undefined8 *)(this_00 + -8) = 0x15a48b;
      poVar7 = std::operator<<(poVar7,"\x1b[m from \x1b[36;1m");
      local_78.g = (pQVar16->super_Solver).game;
      local_78.v = iVar12;
      *(undefined8 *)(this_00 + -8) = 0x15a4a2;
      poVar7 = operator<<(poVar7,&local_78);
      *(undefined8 *)(this_00 + -8) = 0x15a4b1;
      poVar7 = std::operator<<(poVar7,"\x1b[m to \x1b[36;1m");
      pGVar11 = (pQVar16->super_Solver).game;
      iVar12 = pQVar16->strategy[local_48];
      p_Var15 = &local_90;
    }
    p_Var15->g = pGVar11;
    p_Var15->v = iVar12;
    *(undefined8 *)(this_00 + -8) = 0x15a63b;
    poVar7 = operator<<(poVar7,p_Var15);
    *(undefined8 *)(this_00 + -8) = 0x15a64a;
    std::operator<<(poVar7,"\x1b[m\n");
  }
  ppVar18 = local_50;
  if ((pQVar16->super_Solver).trace == 0) {
    return true;
  }
  poVar7 = (pQVar16->super_Solver).logger;
  *(undefined8 *)(this_00 + -8) = 0x15a66c;
  poVar7 = std::operator<<(poVar7,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m");
  local_60.g = (pQVar16->super_Solver).game;
  local_60.v = local_3c;
  *(undefined8 *)(this_00 + -8) = 0x15a68b;
  poVar7 = operator<<(poVar7,&local_60);
  *(undefined8 *)(this_00 + -8) = 0x15a69a;
  std::operator<<(poVar7,"\x1b[m:");
  poVar7 = (pQVar16->super_Solver).logger;
  iVar12 = pQVar16->k;
  *(undefined8 *)(this_00 + -8) = 0x15a6aa;
  pm_stream(poVar7,(int *)ppVar18,iVar12);
  poVar7 = (pQVar16->super_Solver).logger;
  *(undefined8 *)(this_00 + -8) = 0x15a6ba;
  poVar7 = std::operator<<(poVar7," (to ");
  local_60.g = (pQVar16->super_Solver).game;
  local_60.v = pQVar16->strategy[local_48];
LAB_0015a7bd:
  *(undefined8 *)(this_00 + -8) = 0x15a7c9;
  poVar7 = operator<<(poVar7,&local_60);
  *(undefined8 *)(this_00 + -8) = 0x15a7d8;
  std::operator<<(poVar7,")\n");
  return true;
}

Assistant:

bool
QPTSolver::lift(int v, int target)
{
    // check if already Top
    int * const pm = pm_nodes + k*v; // obtain ptr to current progress measure
    if (pm[0] != -1 and (pm[0]&1) == pl) return false;

    const int pr = priority(v);
    int tmp[k], res[k];

#ifndef NDEBUG
    int old_strategy = strategy[v];

    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        pm_stream(logger, pm, k);
        logger << std::endl;
    }
#endif

    // First special cases if we are lifting triggered by a given <target>.

    if (1 and target != -1) {
        if (owner(v) == pl) {
            // if owned by <pl>, just check if target is better.
            au(tmp, pm_nodes + k*target, pr, k, max, maxo, pl);
            if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // lol
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                pm_stream(logger, pm_nodes + k*target, k);
                logger << " => ";
                pm_stream(logger, tmp, k);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, k, pl)) {
                // target is better, update, report, return
                for (int i=0; i<k; i++) pm[i] = tmp[i];
#ifndef NDEBUG
                if (trace and target != strategy[v]) {
                    if (strategy[v] == -1) {
                        logger << "\033[1;38;5;208m";
                        logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    } else {
                        logger << "\033[1;38;5;208m";
                        logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(strategy[v]) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    }
                }
                strategy[v] = target; // does not matter for algorithm, only for output here
#endif
#ifndef NDEBUG
                if (trace) {
                    logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                    pm_stream(logger, pm, k);
                    logger << " (to " << label_vertex(target) << ")\n";
                }
#endif
                return true;
            } else {
                // target not better, not checking other directions
                return false;
            }
        } else {
            // if owned by ~<pl>, test if strategy is target
            if (strategy[v] != -1 and target != strategy[v]) {
                return false; // no need to do anything... strategy is still same
            }
        }
    }

    // Compute best measure by going over all successors

    bool first = true;
    int s_cur = strategy[v];
    if (s_cur != -1) {
        // first set to current...
        au(tmp, pm_nodes + k*s_cur, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(s_cur) << ":";
            pm_stream(logger, pm_nodes + k*s_cur, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        for (int i=0; i<k; i++) res[i] = tmp[i];
        first = false;
    }
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        if (to == s_cur) continue;
        au(tmp, pm_nodes + k*to, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << ":";
            pm_stream(logger, pm_nodes + k*to, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        if (first) {
            first = false;
            for (int i=0; i<k; i++) res[i] = tmp[i];
            strategy[v] = to;
        } else if (owner(v) == pl) {
            // we want the max
            if (pm_less(res, tmp, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        } else {
            // we want the min
            if (pm_less(tmp, res, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        }
    }

    // now "res" contains the best au
    if (pm_less(pm, res, k, pl)) {
        // ok, it's an update
        for (int i=0; i<k; i++) pm[i] = res[i];
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
        if (trace) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            pm_stream(logger, pm, k);
            logger << " (to " << label_vertex(strategy[v]) << ")\n";
        }
#endif
        return true;
    } else {
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
#endif
        return false;
    }
}